

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

string * __thiscall
testing::PrintToString<shared_ptr<A>>
          (string *__return_storage_ptr__,testing *this,shared_ptr<A> *value)

{
  long in_FS_OFFSET;
  stringstream ss;
  stringstream local_1a0 [16];
  undefined1 local_190 [112];
  ios_base local_120 [264];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::_M_insert<long_long>((longlong)local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

::std::string PrintToString(const T& value) {
  ::std::stringstream ss;
  internal::UniversalTersePrinter<T>::Print(value, &ss);
  return ss.str();
}